

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileParser.cpp
# Opt level: O1

void __thiscall Assimp::ObjFileParser::getFace(ObjFileParser *this,aiPrimitiveType type)

{
  pointer *pppFVar1;
  uint *puVar2;
  byte *pbVar3;
  Model *pMVar4;
  pointer paVar5;
  pointer paVar6;
  Mesh *pMVar7;
  iterator __position;
  bool bVar8;
  int iVar9;
  Face *pFVar10;
  int iVar11;
  byte *pbVar12;
  ulong uVar13;
  reference pvVar14;
  Logger *pLVar15;
  runtime_error *this_00;
  int iVar16;
  Material *pMVar17;
  byte bVar18;
  IndexArray *this_01;
  uint uVar19;
  ulong uVar20;
  byte *pbVar21;
  int iVar22;
  int iVar23;
  Face *face;
  Face *local_80;
  undefined4 local_74;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  int local_50;
  int local_4c;
  int local_48;
  aiPrimitiveType local_44;
  pointer local_40;
  pointer local_38;
  
  pbVar12 = (byte *)(this->m_DataIt)._M_current;
  pbVar3 = (byte *)(this->m_DataItEnd)._M_current;
  pbVar21 = pbVar3 + -1;
  bVar8 = pbVar21 == pbVar12 || pbVar12 == pbVar3;
  if (pbVar21 != pbVar12 && pbVar12 != pbVar3) {
    do {
      if (((ulong)*pbVar12 < 0x21) && ((0x100003601U >> ((ulong)*pbVar12 & 0x3f) & 1) != 0)) {
        if (!bVar8) goto LAB_0046e8c3;
        break;
      }
      pbVar12 = pbVar12 + 1;
      bVar8 = pbVar12 == pbVar21 || pbVar12 == pbVar3;
    } while (pbVar12 != pbVar21 && pbVar12 != pbVar3);
  }
  goto LAB_0046e8dd;
  while (pbVar12 != pbVar21) {
LAB_0046e8c3:
    if (((*pbVar12 != 0x20) && (*pbVar12 != 9)) || (pbVar12 = pbVar12 + 1, pbVar12 == pbVar3))
    break;
  }
LAB_0046e8dd:
  (this->m_DataIt)._M_current = (char *)pbVar12;
  if ((pbVar12 != pbVar3) && (*pbVar12 != 0)) {
    local_80 = (Face *)operator_new(0x58);
    local_80->m_PrimitiveType = type;
    (local_80->m_vertices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (local_80->m_vertices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_80->m_vertices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (local_80->m_normals).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (local_80->m_normals).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_80->m_normals).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (local_80->m_texturCoords).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (local_80->m_texturCoords).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_80->m_texturCoords).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_80->m_pMaterial = (Material *)0x0;
    pbVar21 = (byte *)(this->m_DataIt)._M_current;
    if (pbVar21 == (byte *)(this->m_DataItEnd)._M_current) {
      bVar18 = 1;
    }
    else {
      pMVar4 = (this->m_pModel)._M_t.
               super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
               ._M_t.
               super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
               .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl;
      paVar5 = *(pointer *)
                &(pMVar4->m_Normals).
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl;
      local_48 = (int)((ulong)((long)*(pointer *)
                                      ((long)&(pMVar4->m_Vertices).
                                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                      + 8) -
                              *(long *)&(pMVar4->m_Vertices).
                                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                        ._M_impl) >> 2) * -0x55555555;
      local_38 = *(pointer *)
                  ((long)&(pMVar4->m_TextureCoord).
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                  + 8);
      local_40 = *(pointer *)
                  &(pMVar4->m_TextureCoord).
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl;
      local_4c = (int)((ulong)((long)local_38 - (long)local_40) >> 2) * -0x55555555;
      paVar6 = *(pointer *)
                ((long)&(pMVar4->m_Normals).
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> +
                8);
      local_50 = (int)((ulong)((long)paVar6 - (long)paVar5) >> 2) * -0x55555555;
      local_74 = 0;
      iVar22 = 0;
      local_44 = type;
      do {
        uVar13 = (ulong)*pbVar21;
        if (uVar13 < 0x30) {
          uVar20 = 1;
          if ((0x100000200U >> (uVar13 & 0x3f) & 1) == 0) {
            if (uVar13 != 0x2f) {
              if ((0x3401UL >> (uVar13 & 0x3f) & 1) == 0) goto LAB_0046ea08;
              break;
            }
            if (local_44 == aiPrimitiveType_POINT) {
              pLVar15 = DefaultLogger::get();
              Logger::error(pLVar15,"Obj: Separator unexpected in point statement");
            }
            iVar23 = iVar22 + 1;
          }
          else {
            iVar23 = 0;
          }
        }
        else {
LAB_0046ea08:
          iVar11 = atoi((char *)pbVar21);
          pFVar10 = local_80;
          uVar19 = -(iVar11 >> 0x1f);
          iVar16 = iVar11;
          for (iVar23 = iVar11; uVar19 = uVar19 + 1, 0x12 < iVar23 + 9U; iVar23 = iVar23 - iVar9) {
            iVar9 = iVar16 >> 0x1f;
            iVar23 = iVar16 / 10 + iVar9;
            iVar16 = iVar23 - iVar9;
          }
          iVar23 = (paVar5 != paVar6) + 1;
          if (iVar22 != 1) {
            iVar23 = iVar22;
          }
          if (local_40 != local_38) {
            iVar23 = iVar22;
          }
          if (iVar11 < 1) {
            if (-1 < iVar11) {
              if (local_80 != (Face *)0x0) {
                ObjFile::Face::~Face(local_80);
                operator_delete(pFVar10,0x58);
              }
              this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
              local_70[0] = local_60;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_70,"OBJ: Invalid face indice","");
              std::runtime_error::runtime_error(this_00,(string *)local_70);
              *(undefined ***)this_00 = &PTR__runtime_error_008e3168;
              __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
            }
            if (iVar23 == 2) {
              iVar11 = iVar11 + local_50;
              goto LAB_0046eaf3;
            }
            if (iVar23 == 1) {
              this_01 = &local_80->m_texturCoords;
              iVar11 = iVar11 + local_4c;
            }
            else {
              if (iVar23 != 0) goto LAB_0046eaa5;
              this_01 = &local_80->m_vertices;
              iVar11 = iVar11 + local_48;
            }
LAB_0046ead6:
            local_70[0] = (undefined1 *)CONCAT44(local_70[0]._4_4_,iVar11);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                      (this_01,(uint *)local_70);
          }
          else {
            if (iVar23 != 2) {
              if (iVar23 == 1) {
                this_01 = &local_80->m_texturCoords;
              }
              else {
                if (iVar23 != 0) {
LAB_0046eaa5:
                  reportErrorTokenInFace(this);
                  goto LAB_0046eb07;
                }
                this_01 = &local_80->m_vertices;
              }
              iVar11 = iVar11 + -1;
              goto LAB_0046ead6;
            }
            iVar11 = iVar11 + -1;
LAB_0046eaf3:
            local_70[0] = (undefined1 *)CONCAT44(local_70[0]._4_4_,iVar11);
            pvVar14 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                      emplace_back<unsigned_int>(&local_80->m_normals,(uint *)local_70);
            local_74 = (undefined4)CONCAT71((int7)((ulong)pvVar14 >> 8),1);
          }
LAB_0046eb07:
          uVar20 = (ulong)uVar19;
        }
        pbVar21 = (byte *)((this->m_DataIt)._M_current + uVar20);
        (this->m_DataIt)._M_current = (char *)pbVar21;
        iVar22 = iVar23;
      } while (pbVar21 != (byte *)(this->m_DataItEnd)._M_current);
      bVar18 = (byte)local_74 ^ 1;
    }
    if ((local_80->m_vertices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        (local_80->m_vertices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      pLVar15 = DefaultLogger::get();
      Logger::error(pLVar15,"Obj: Ignoring empty face");
      pFVar10 = local_80;
      pbVar21 = (byte *)(this->m_DataIt)._M_current;
      pbVar12 = (byte *)(this->m_DataItEnd)._M_current;
      if (pbVar12 + -1 != pbVar21 && pbVar21 != pbVar12) {
        while ((0xd < *pbVar21 || ((0x3401U >> (*pbVar21 & 0x1f) & 1) == 0))) {
          pbVar21 = pbVar21 + 1;
          if ((pbVar21 == pbVar12) || (pbVar21 == pbVar12 + -1)) break;
        }
      }
      pbVar3 = pbVar21;
      if (pbVar21 != pbVar12) {
        pbVar21 = pbVar21 + 1;
        this->m_uiLine = this->m_uiLine + 1;
        pbVar3 = pbVar21;
      }
      for (; (pbVar3 != pbVar12 && ((*pbVar3 == 0x20 || (pbVar21 = pbVar3, *pbVar3 == 9))));
          pbVar3 = pbVar3 + 1) {
        pbVar21 = pbVar12;
      }
      (this->m_DataIt)._M_current = (char *)pbVar21;
      if (local_80 != (Face *)0x0) {
        ObjFile::Face::~Face(local_80);
        operator_delete(pFVar10,0x58);
      }
    }
    else {
      pMVar4 = (this->m_pModel)._M_t.
               super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
               ._M_t.
               super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
               .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl;
      pMVar17 = pMVar4->m_pCurrentMaterial;
      if (pMVar17 == (Material *)0x0) {
        pMVar17 = pMVar4->m_pDefaultMaterial;
      }
      local_80->m_pMaterial = pMVar17;
      if (((this->m_pModel)._M_t.
           super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
           ._M_t.
           super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
           .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl)->m_pCurrent ==
          (Object *)0x0) {
        createObject(this,(string *)DefaultObjName_abi_cxx11_);
      }
      if (((this->m_pModel)._M_t.
           super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
           ._M_t.
           super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
           .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl)->m_pCurrentMesh ==
          (Mesh *)0x0) {
        createMesh(this,(string *)DefaultObjName_abi_cxx11_);
      }
      pMVar7 = ((this->m_pModel)._M_t.
                super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
                ._M_t.
                super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
                .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl)->
               m_pCurrentMesh;
      __position._M_current =
           *(pointer *)
            ((long)&(pMVar7->m_Faces).
                    super__Vector_base<Assimp::ObjFile::Face_*,_std::allocator<Assimp::ObjFile::Face_*>_>
            + 8);
      if (__position._M_current ==
          *(pointer *)
           ((long)&(pMVar7->m_Faces).
                   super__Vector_base<Assimp::ObjFile::Face_*,_std::allocator<Assimp::ObjFile::Face_*>_>
           + 0x10)) {
        std::vector<Assimp::ObjFile::Face*,std::allocator<Assimp::ObjFile::Face*>>::
        _M_realloc_insert<Assimp::ObjFile::Face*const&>
                  ((vector<Assimp::ObjFile::Face*,std::allocator<Assimp::ObjFile::Face*>> *)
                   &pMVar7->m_Faces,__position,&local_80);
      }
      else {
        *__position._M_current = local_80;
        pppFVar1 = (pointer *)
                   ((long)&(pMVar7->m_Faces).
                           super__Vector_base<Assimp::ObjFile::Face_*,_std::allocator<Assimp::ObjFile::Face_*>_>
                   + 8);
        *pppFVar1 = *pppFVar1 + 1;
      }
      puVar2 = &((this->m_pModel)._M_t.
                 super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
                 .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl)->
                m_pCurrentMesh->m_uiNumIndices;
      *puVar2 = *puVar2 + (int)((ulong)((long)(local_80->m_vertices).
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)(local_80->m_vertices).
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 2);
      puVar2 = ((this->m_pModel)._M_t.
                super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
                ._M_t.
                super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
                .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl)->
               m_pCurrentMesh->m_uiUVCoordinates;
      *puVar2 = *puVar2 + (int)((ulong)((long)(local_80->m_texturCoords).
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)(local_80->m_texturCoords).
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 2);
      pMVar7 = ((this->m_pModel)._M_t.
                super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
                ._M_t.
                super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
                .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl)->
               m_pCurrentMesh;
      if (((bVar18 | pMVar7->m_hasNormals) & 1) == 0) {
        pMVar7->m_hasNormals = true;
      }
      pbVar21 = (byte *)(this->m_DataIt)._M_current;
      pbVar12 = (byte *)(this->m_DataItEnd)._M_current;
      if (pbVar12 + -1 != pbVar21 && pbVar21 != pbVar12) {
        do {
          if (((*pbVar21 < 0xe) && ((0x3401U >> (*pbVar21 & 0x1f) & 1) != 0)) ||
             (pbVar21 = pbVar21 + 1, pbVar21 == pbVar12)) break;
        } while (pbVar21 != pbVar12 + -1);
      }
      pbVar3 = pbVar21;
      if (pbVar21 != pbVar12) {
        pbVar21 = pbVar21 + 1;
        this->m_uiLine = this->m_uiLine + 1;
        pbVar3 = pbVar21;
      }
      for (; (pbVar3 != pbVar12 && ((*pbVar3 == 0x20 || (pbVar21 = pbVar3, *pbVar3 == 9))));
          pbVar3 = pbVar3 + 1) {
        pbVar21 = pbVar12;
      }
      (this->m_DataIt)._M_current = (char *)pbVar21;
    }
  }
  return;
}

Assistant:

void ObjFileParser::getFace( aiPrimitiveType type ) {
    m_DataIt = getNextToken<DataArrayIt>( m_DataIt, m_DataItEnd );
    if ( m_DataIt == m_DataItEnd || *m_DataIt == '\0' ) {
        return;
    }

    ObjFile::Face *face = new ObjFile::Face( type );
    bool hasNormal = false;

    const int vSize = static_cast<unsigned int>(m_pModel->m_Vertices.size());
    const int vtSize = static_cast<unsigned int>(m_pModel->m_TextureCoord.size());
    const int vnSize = static_cast<unsigned int>(m_pModel->m_Normals.size());

    const bool vt = (!m_pModel->m_TextureCoord.empty());
    const bool vn = (!m_pModel->m_Normals.empty());
    int iStep = 0, iPos = 0;
    while ( m_DataIt != m_DataItEnd ) {
        iStep = 1;

        if ( IsLineEnd( *m_DataIt ) ) {
            break;
        }

        if ( *m_DataIt =='/' ) {
            if (type == aiPrimitiveType_POINT) {
                ASSIMP_LOG_ERROR("Obj: Separator unexpected in point statement");
            }
            iPos++;
        } else if( IsSpaceOrNewLine( *m_DataIt ) ) {
            iPos = 0;
        } else {
            //OBJ USES 1 Base ARRAYS!!!!
            const int iVal( ::atoi( & ( *m_DataIt ) ) );

            // increment iStep position based off of the sign and # of digits
            int tmp = iVal;
            if ( iVal < 0 ) {
                ++iStep;
            }
            while ( ( tmp = tmp / 10 ) != 0 ) {
                ++iStep;
            }

            if (iPos == 1 && !vt && vn)
                iPos = 2; // skip texture coords for normals if there are no tex coords

            if ( iVal > 0 ) {
                // Store parsed index
                if ( 0 == iPos ) {
                    face->m_vertices.push_back( iVal - 1 );
                } else if ( 1 == iPos ) {
                    face->m_texturCoords.push_back( iVal - 1 );
                } else if ( 2 == iPos ) {
                    face->m_normals.push_back( iVal - 1 );
                    hasNormal = true;
                } else {
                    reportErrorTokenInFace();
                }
            } else if ( iVal < 0 ) {
                // Store relatively index
                if ( 0 == iPos ) {
                    face->m_vertices.push_back( vSize + iVal );
                } else if ( 1 == iPos ) {
                    face->m_texturCoords.push_back( vtSize + iVal );
                } else if ( 2 == iPos ) {
                    face->m_normals.push_back( vnSize + iVal );
                    hasNormal = true;
                } else {
                    reportErrorTokenInFace();
                }
            } else {
                //On error, std::atoi will return 0 which is not a valid value
                delete face;
                throw DeadlyImportError("OBJ: Invalid face indice");
            }

        }
        m_DataIt += iStep;
    }

    if ( face->m_vertices.empty() ) {
        ASSIMP_LOG_ERROR("Obj: Ignoring empty face");
        // skip line and clean up
        m_DataIt = skipLine<DataArrayIt>( m_DataIt, m_DataItEnd, m_uiLine );
        delete face;
        return;
    }

    // Set active material, if one set
    if( NULL != m_pModel->m_pCurrentMaterial ) {
        face->m_pMaterial = m_pModel->m_pCurrentMaterial;
    } else {
        face->m_pMaterial = m_pModel->m_pDefaultMaterial;
    }

    // Create a default object, if nothing is there
    if( NULL == m_pModel->m_pCurrent ) {
        createObject( DefaultObjName );
    }

    // Assign face to mesh
    if ( NULL == m_pModel->m_pCurrentMesh ) {
        createMesh( DefaultObjName );
    }

    // Store the face
    m_pModel->m_pCurrentMesh->m_Faces.push_back( face );
    m_pModel->m_pCurrentMesh->m_uiNumIndices += (unsigned int) face->m_vertices.size();
    m_pModel->m_pCurrentMesh->m_uiUVCoordinates[ 0 ] += (unsigned int) face->m_texturCoords.size();
    if( !m_pModel->m_pCurrentMesh->m_hasNormals && hasNormal ) {
        m_pModel->m_pCurrentMesh->m_hasNormals = true;
    }
    // Skip the rest of the line
    m_DataIt = skipLine<DataArrayIt>( m_DataIt, m_DataItEnd, m_uiLine );
}